

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O2

void ** hash_AddElement(HashMapEntry **map,char *key,void *element)

{
  HashType HVar1;
  HashMapEntry *pHVar2;
  
  HVar1 = hash(key);
  pHVar2 = (HashMapEntry *)malloc(0x20);
  if (pHVar2 != (HashMapEntry *)0x0) {
    pHVar2->hash = (HalfHashType)(HVar1 >> 0x10);
    pHVar2->key = key;
    pHVar2->content = element;
    pHVar2->next = map[HVar1 & 0xffff];
    map[HVar1 & 0xffff] = pHVar2;
    return &pHVar2->content;
  }
  err("%s: Failed to allocate new entry","hash_AddElement");
}

Assistant:

void **hash_AddElement(HashMap map, char const *key, void *element)
{
	HashType hashedKey = hash(key);
	HalfHashType index = hashedKey;
	struct HashMapEntry *newEntry = (struct HashMapEntry *)malloc(sizeof(*newEntry));

	if (!newEntry)
		err("%s: Failed to allocate new entry", __func__);

	newEntry->hash = hashedKey >> HALF_HASH_NB_BITS;
	newEntry->key = key;
	newEntry->content = element;
	newEntry->next = map[index];
	map[index] = newEntry;

	return &newEntry->content;
}